

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O3

tuple<double,_int> __thiscall trento::Collider::sample_collision(Collider *this)

{
  double dVar1;
  NucleonData *pNVar2;
  NucleonData *pNVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  NucleonData *B;
  long *in_RSI;
  int iVar7;
  NucleonData *A;
  NucleonData *A_00;
  double dVar8;
  _Head_base<0UL,_double,_false> _Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  tuple<double,_int> tVar14;
  
  iVar7 = 0;
  do {
    dVar1 = (double)in_RSI[0x1f];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = in_RSI[0x20];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1 * dVar1;
    auVar10 = vfmsub231sd_fma(auVar12,auVar10,auVar10);
    dVar8 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)&random::engine);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar8 * auVar10._0_8_;
    auVar10 = vfmadd231sd_fma(auVar11,auVar13,auVar13);
    if (auVar10._0_8_ < 0.0) {
      _Var9._M_head_impl = sqrt(auVar10._0_8_);
    }
    else {
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      _Var9._M_head_impl = auVar10._0_8_;
    }
    Nucleus::sample_nucleons((Nucleus *)*in_RSI,_Var9._M_head_impl * (double)in_RSI[0x21]);
    Nucleus::sample_nucleons
              ((Nucleus *)in_RSI[1],((double)in_RSI[0x21] + -1.0) * _Var9._M_head_impl);
    bVar6 = 0;
    pNVar2 = *(NucleonData **)(*in_RSI + 0x10);
    for (A_00 = *(NucleonData **)(*in_RSI + 8); A_00 != pNVar2; A_00 = A_00 + 1) {
      pNVar3 = *(NucleonData **)(in_RSI[1] + 0x10);
      for (B = *(NucleonData **)(in_RSI[1] + 8); B != pNVar3; B = B + 1) {
        bVar4 = NucleonCommon::participate((NucleonCommon *)(in_RSI + 2),A_00,B);
        uVar5 = (uint)*(byte *)((long)in_RSI + 0xf4);
        if (!bVar4) {
          uVar5 = 0;
        }
        bVar6 = bVar6 | bVar4;
        iVar7 = iVar7 + uVar5;
      }
    }
  } while (bVar6 == 0);
  *(int *)&(this->nucleusA_)._M_t.
           super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
           super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl = iVar7;
  (this->nucleusB_)._M_t.
  super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
  super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
  super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl = (Nucleus *)_Var9._M_head_impl;
  tVar14.super__Tuple_impl<0UL,_double,_int>.super__Head_base<0UL,_double,_false>._M_head_impl =
       _Var9._M_head_impl;
  tVar14.super__Tuple_impl<0UL,_double,_int>._0_8_ = this;
  return (tuple<double,_int>)tVar14.super__Tuple_impl<0UL,_double,_int>;
}

Assistant:

std::tuple<double, int> Collider::sample_collision() {
  // Sample impact parameters until at least one nucleon-nucleon pair
  // participates.  The bool 'collision' keeps track -- it is effectively a
  // logical OR over all possible participant pairs.
  // Returns the sampled impact parameter b, and binary collision number ncoll.
  double b;
  int ncoll = 0;
  bool collision = false;

  do {
    // Sample b from P(b)db = 2*pi*b.
    b = std::sqrt(bmin_ * bmin_ + (bmax_ * bmax_ - bmin_ * bmin_) * random::canonical<double>());

    // Offset each nucleus depending on the asymmetry parameter (see header).
    nucleusA_->sample_nucleons(asymmetry_ * b);
    nucleusB_->sample_nucleons((asymmetry_ - 1.) * b);

    // Check each nucleon-nucleon pair.
    for (auto&& A : *nucleusA_) {
      for (auto&& B : *nucleusB_) {
        auto new_collision = nucleon_common_.participate(A, B);
        if (new_collision && calc_ncoll_) ++ncoll;
        collision = new_collision || collision;
      }
    }
  } while (!collision);

  return std::make_tuple(b, ncoll);
}